

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O1

void ** __thiscall
TCMallocImplementation::ReadStackTraces(TCMallocImplementation *this,int *sample_period)

{
  int iVar1;
  ThreadCache *this_00;
  void **ppvVar2;
  undefined1 *puVar3;
  long *in_FS_OFFSET;
  bool bVar4;
  ThreadCachePtr TVar5;
  undefined1 local_48 [8];
  StackTraceTable table;
  SpinLockHolder h;
  
  local_48[0] = false;
  table.error_ = false;
  table._1_7_ = 0;
  table._16_8_ = 0x154f00;
  LOCK();
  bVar4 = tcmalloc::Static::pageheap_._8_4_ == 0;
  if (bVar4) {
    tcmalloc::Static::pageheap_._8_4_ = 1;
  }
  UNLOCK();
  if (!bVar4) {
    SpinLock::SlowLock((SpinLock *)(tcmalloc::Static::pageheap_ + 8));
  }
  puVar3 = tcmalloc::Static::sampled_objects_;
  while (puVar3 = *(undefined1 **)(puVar3 + 0x10), puVar3 != tcmalloc::Static::sampled_objects_) {
    tcmalloc::StackTraceTable::AddTrace((StackTraceTable *)local_48,*(StackTrace **)(puVar3 + 0x20))
    ;
  }
  SpinLockHolder::~SpinLockHolder((SpinLockHolder *)&table.field_0x10);
  this_00 = (ThreadCache *)*in_FS_OFFSET;
  if (this_00 == (ThreadCache *)0x0) {
    TVar5 = tcmalloc::ThreadCachePtr::GetSlow();
    this_00 = TVar5.ptr_;
  }
  iVar1 = tcmalloc::ThreadCache::GetSamplePeriod(this_00);
  *sample_period = iVar1;
  ppvVar2 = tcmalloc::StackTraceTable::ReadStackTracesAndClear((StackTraceTable *)local_48);
  return ppvVar2;
}

Assistant:

virtual void** ReadStackTraces(int* sample_period) {
    tcmalloc::StackTraceTable table;
    {
      SpinLockHolder h(Static::pageheap_lock());
      Span* sampled = Static::sampled_objects();
      for (Span* s = sampled->next; s != sampled; s = s->next) {
        table.AddTrace(*reinterpret_cast<StackTrace*>(s->objects));
      }
    }
    *sample_period = ThreadCachePtr::Grab()->GetSamplePeriod();
    return table.ReadStackTracesAndClear(); // grabs and releases pageheap_lock
  }